

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void extendResult(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *result,vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          *contents)

{
  TextContent *this;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *pvVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  reference ppcVar5;
  size_t length;
  const_iterator __first;
  const_iterator __last;
  bool bVar6;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_98;
  const_iterator local_90;
  cmGeneratorExpressionEvaluator **local_80;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_78;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_70;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_68;
  const_iterator local_60;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_58;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_50;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_48;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_40;
  TextContent *local_38;
  TextContent *textContent;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_28;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_20;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_18;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *contents_local;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *result_local;
  
  local_18 = contents;
  contents_local = result;
  bVar2 = std::
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          ::empty(result);
  bVar6 = false;
  if (!bVar2) {
    local_28._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    local_20 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator-(&local_28,1);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_20);
    iVar3 = (*(*ppcVar4)->_vptr_cmGeneratorExpressionEvaluator[2])();
    bVar6 = false;
    if (iVar3 == 0) {
      textContent = (TextContent *)
                    std::
                    vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                    ::begin(local_18);
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                ::operator*((__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                             *)&textContent);
      iVar3 = (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[2])();
      bVar6 = iVar3 == 0;
    }
  }
  pvVar1 = contents_local;
  if (bVar6) {
    local_48._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    local_40 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator-(&local_48,1);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_40);
    this = (TextContent *)*ppcVar4;
    local_38 = this;
    local_50._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::begin(local_18);
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_50);
    length = TextContent::GetLength((TextContent *)*ppcVar5);
    TextContent::Extend(this,length);
    local_58._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::begin(local_18);
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_58);
    if (*ppcVar5 != (cmGeneratorExpressionEvaluator *)0x0) {
      (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[1])();
    }
    pvVar1 = contents_local;
    local_68._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
    ::__normal_iterator<cmGeneratorExpressionEvaluator**>
              ((__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
                *)&local_60,&local_68);
    local_78._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::begin(local_18);
    local_70 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator+(&local_78,1);
    local_80 = (cmGeneratorExpressionEvaluator **)
               std::
               vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
               ::end(local_18);
    std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
    insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>,void>
              ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                *)pvVar1,local_60,local_70,
               (__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                )local_80);
  }
  else {
    local_98._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
    ::__normal_iterator<cmGeneratorExpressionEvaluator**>
              ((__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
                *)&local_90,&local_98);
    __first = std::
              vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ::begin(local_18);
    __last = std::
             vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             ::end(local_18);
    std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
    insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>,void>
              ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                *)pvVar1,local_90,
               (__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                )__first._M_current,
               (__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

static void extendResult(
  std::vector<cmGeneratorExpressionEvaluator*>& result,
  const std::vector<cmGeneratorExpressionEvaluator*>& contents)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text &&
      (*contents.begin())->GetType() == cmGeneratorExpressionEvaluator::Text) {
    TextContent* textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(
      static_cast<TextContent*>(*contents.begin())->GetLength());
    delete *contents.begin();
    result.insert(result.end(), contents.begin() + 1, contents.end());
  } else {
    result.insert(result.end(), contents.begin(), contents.end());
  }
}